

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

void __thiscall
icu_63::UnicodeString::UnicodeString(UnicodeString *this,int32_t capacity,UChar32 c,int32_t count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  undefined1 auVar4 [16];
  UBool UVar5;
  char16_t *pcVar6;
  long lVar7;
  ushort uVar8;
  ulong uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  int iVar32;
  int iVar35;
  undefined1 auVar33 [16];
  int iVar36;
  undefined1 auVar34 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar39 [16];
  long lVar14;
  
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003b2258
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 0;
  if ((uint)c < 0x110000 && 0 < count) {
    uVar8 = (ushort)c;
    if ((uint)c < 0x10000) {
      if (capacity <= count) {
        capacity = count;
      }
      UVar5 = allocate(this,capacity);
      auVar4 = _DAT_002edd70;
      if (UVar5 == '\0') {
        return;
      }
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar6 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar6 = (char16_t *)((long)&this->fUnion + 2);
      }
      lVar7 = (ulong)(uint)count - 1;
      auVar10._8_4_ = (int)lVar7;
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar10 = auVar10 ^ _DAT_002edd70;
      auVar13 = _DAT_002f55b0;
      auVar15 = _DAT_002f55c0;
      auVar16 = _DAT_002edd50;
      auVar17 = _DAT_002edd60;
      do {
        auVar18 = auVar17 ^ auVar4;
        iVar32 = auVar10._0_4_;
        iVar31 = -(uint)(iVar32 < auVar18._0_4_);
        iVar11 = auVar10._4_4_;
        auVar19._4_4_ = -(uint)(iVar11 < auVar18._4_4_);
        iVar36 = auVar10._8_4_;
        iVar35 = -(uint)(iVar36 < auVar18._8_4_);
        iVar12 = auVar10._12_4_;
        auVar19._12_4_ = -(uint)(iVar12 < auVar18._12_4_);
        auVar28._4_4_ = iVar31;
        auVar28._0_4_ = iVar31;
        auVar28._8_4_ = iVar35;
        auVar28._12_4_ = iVar35;
        auVar37 = pshuflw(in_XMM11,auVar28,0xe8);
        auVar21._4_4_ = -(uint)(auVar18._4_4_ == iVar11);
        auVar21._12_4_ = -(uint)(auVar18._12_4_ == iVar12);
        auVar21._0_4_ = auVar21._4_4_;
        auVar21._8_4_ = auVar21._12_4_;
        auVar39 = pshuflw(in_XMM12,auVar21,0xe8);
        auVar19._0_4_ = auVar19._4_4_;
        auVar19._8_4_ = auVar19._12_4_;
        auVar38 = pshuflw(auVar37,auVar19,0xe8);
        auVar18._8_4_ = 0xffffffff;
        auVar18._0_8_ = 0xffffffffffffffff;
        auVar18._12_4_ = 0xffffffff;
        auVar18 = (auVar38 | auVar39 & auVar37) ^ auVar18;
        auVar18 = packssdw(auVar18,auVar18);
        if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(ushort *)((long)pcVar6 + lVar7) = uVar8;
        }
        auVar19 = auVar21 & auVar28 | auVar19;
        auVar18 = packssdw(auVar19,auVar19);
        auVar38._8_4_ = 0xffffffff;
        auVar38._0_8_ = 0xffffffffffffffff;
        auVar38._12_4_ = 0xffffffff;
        auVar18 = packssdw(auVar18 ^ auVar38,auVar18 ^ auVar38);
        if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
          *(ushort *)((long)pcVar6 + lVar7 + 2) = uVar8;
        }
        auVar18 = auVar16 ^ auVar4;
        iVar31 = -(uint)(iVar32 < auVar18._0_4_);
        auVar33._4_4_ = -(uint)(iVar11 < auVar18._4_4_);
        iVar35 = -(uint)(iVar36 < auVar18._8_4_);
        auVar33._12_4_ = -(uint)(iVar12 < auVar18._12_4_);
        auVar20._4_4_ = iVar31;
        auVar20._0_4_ = iVar31;
        auVar20._8_4_ = iVar35;
        auVar20._12_4_ = iVar35;
        auVar27._4_4_ = -(uint)(auVar18._4_4_ == iVar11);
        auVar27._12_4_ = -(uint)(auVar18._12_4_ == iVar12);
        auVar27._0_4_ = auVar27._4_4_;
        auVar27._8_4_ = auVar27._12_4_;
        auVar33._0_4_ = auVar33._4_4_;
        auVar33._8_4_ = auVar33._12_4_;
        auVar18 = auVar27 & auVar20 | auVar33;
        auVar18 = packssdw(auVar18,auVar18);
        auVar1._8_4_ = 0xffffffff;
        auVar1._0_8_ = 0xffffffffffffffff;
        auVar1._12_4_ = 0xffffffff;
        auVar18 = packssdw(auVar18 ^ auVar1,auVar18 ^ auVar1);
        if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(ushort *)((long)pcVar6 + lVar7 + 4) = uVar8;
        }
        auVar21 = pshufhw(auVar20,auVar20,0x84);
        auVar28 = pshufhw(auVar27,auVar27,0x84);
        auVar19 = pshufhw(auVar21,auVar33,0x84);
        auVar22._8_4_ = 0xffffffff;
        auVar22._0_8_ = 0xffffffffffffffff;
        auVar22._12_4_ = 0xffffffff;
        auVar22 = (auVar19 | auVar28 & auVar21) ^ auVar22;
        auVar21 = packssdw(auVar22,auVar22);
        if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(ushort *)((long)pcVar6 + lVar7 + 6) = uVar8;
        }
        auVar21 = auVar15 ^ auVar4;
        iVar31 = -(uint)(iVar32 < auVar21._0_4_);
        auVar24._4_4_ = -(uint)(iVar11 < auVar21._4_4_);
        iVar35 = -(uint)(iVar36 < auVar21._8_4_);
        auVar24._12_4_ = -(uint)(iVar12 < auVar21._12_4_);
        auVar29._4_4_ = iVar31;
        auVar29._0_4_ = iVar31;
        auVar29._8_4_ = iVar35;
        auVar29._12_4_ = iVar35;
        auVar18 = pshuflw(auVar18,auVar29,0xe8);
        auVar23._4_4_ = -(uint)(auVar21._4_4_ == iVar11);
        auVar23._12_4_ = -(uint)(auVar21._12_4_ == iVar12);
        auVar23._0_4_ = auVar23._4_4_;
        auVar23._8_4_ = auVar23._12_4_;
        in_XMM12 = pshuflw(auVar39 & auVar37,auVar23,0xe8);
        in_XMM12 = in_XMM12 & auVar18;
        auVar24._0_4_ = auVar24._4_4_;
        auVar24._8_4_ = auVar24._12_4_;
        auVar18 = pshuflw(auVar18,auVar24,0xe8);
        auVar37._8_4_ = 0xffffffff;
        auVar37._0_8_ = 0xffffffffffffffff;
        auVar37._12_4_ = 0xffffffff;
        auVar37 = (auVar18 | in_XMM12) ^ auVar37;
        auVar18 = packssdw(auVar37,auVar37);
        if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(ushort *)((long)pcVar6 + lVar7 + 8) = uVar8;
        }
        auVar24 = auVar23 & auVar29 | auVar24;
        auVar18 = packssdw(auVar24,auVar24);
        auVar39._8_4_ = 0xffffffff;
        auVar39._0_8_ = 0xffffffffffffffff;
        auVar39._12_4_ = 0xffffffff;
        auVar18 = packssdw(auVar18 ^ auVar39,auVar18 ^ auVar39);
        if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(ushort *)((long)pcVar6 + lVar7 + 10) = uVar8;
        }
        auVar18 = auVar13 ^ auVar4;
        iVar32 = -(uint)(iVar32 < auVar18._0_4_);
        auVar34._4_4_ = -(uint)(iVar11 < auVar18._4_4_);
        iVar36 = -(uint)(iVar36 < auVar18._8_4_);
        auVar34._12_4_ = -(uint)(iVar12 < auVar18._12_4_);
        auVar25._4_4_ = iVar32;
        auVar25._0_4_ = iVar32;
        auVar25._8_4_ = iVar36;
        auVar25._12_4_ = iVar36;
        auVar30._4_4_ = -(uint)(auVar18._4_4_ == iVar11);
        auVar30._12_4_ = -(uint)(auVar18._12_4_ == iVar12);
        auVar30._0_4_ = auVar30._4_4_;
        auVar30._8_4_ = auVar30._12_4_;
        auVar34._0_4_ = auVar34._4_4_;
        auVar34._8_4_ = auVar34._12_4_;
        auVar18 = auVar30 & auVar25 | auVar34;
        auVar18 = packssdw(auVar18,auVar18);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar18 ^ auVar2,auVar18 ^ auVar2);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(ushort *)((long)pcVar6 + lVar7 + 0xc) = uVar8;
        }
        auVar18 = pshufhw(auVar25,auVar25,0x84);
        auVar19 = pshufhw(auVar30,auVar30,0x84);
        auVar21 = pshufhw(auVar18,auVar34,0x84);
        auVar26._8_4_ = 0xffffffff;
        auVar26._0_8_ = 0xffffffffffffffff;
        auVar26._12_4_ = 0xffffffff;
        auVar26 = (auVar21 | auVar19 & auVar18) ^ auVar26;
        auVar18 = packssdw(auVar26,auVar26);
        if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(ushort *)((long)pcVar6 + lVar7 + 0xe) = uVar8;
        }
        lVar14 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 8;
        auVar17._8_8_ = lVar14 + 8;
        lVar14 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 8;
        auVar16._8_8_ = lVar14 + 8;
        lVar14 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 8;
        auVar15._8_8_ = lVar14 + 8;
        lVar14 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 8;
        auVar13._8_8_ = lVar14 + 8;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(count + 7U >> 3) << 4 != lVar7);
      uVar8 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (count < 0x400) {
        (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(count << 5) | uVar8 & 0x1f;
        return;
      }
      (this->fUnion).fStackFields.fLengthAndFlags = uVar8 | 0xffe0;
      (this->fUnion).fFields.fLength = count;
      return;
    }
    if ((uint)count < 0x40000000) {
      uVar3 = count * 2;
      if (capacity < (int)uVar3) {
        capacity = uVar3;
      }
      UVar5 = allocate(this,capacity);
      if (UVar5 == '\0') {
        return;
      }
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar6 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar6 = (char16_t *)((long)&this->fUnion + 2);
      }
      uVar9 = 0;
      do {
        pcVar6[uVar9] = (short)((uint)c >> 10) + L'ퟀ';
        pcVar6[uVar9 + 1] = uVar8 & 0x3ff | 0xdc00;
        uVar9 = uVar9 + 2;
      } while (uVar9 < uVar3);
      uVar8 = (this->fUnion).fStackFields.fLengthAndFlags;
      if ((uint)count < 0x200) {
        (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(count << 6) | uVar8 & 0x1f;
        return;
      }
      (this->fUnion).fStackFields.fLengthAndFlags = uVar8 | 0xffe0;
      (this->fUnion).fFields.fLength = uVar3;
      return;
    }
  }
  allocate(this,capacity);
  return;
}

Assistant:

UnicodeString::UnicodeString(int32_t capacity, UChar32 c, int32_t count) {
  fUnion.fFields.fLengthAndFlags = 0;
  if(count <= 0 || (uint32_t)c > 0x10ffff) {
    // just allocate and do not do anything else
    allocate(capacity);
  } else if(c <= 0xffff) {
    int32_t length = count;
    if(capacity < length) {
      capacity = length;
    }
    if(allocate(capacity)) {
      UChar *array = getArrayStart();
      UChar unit = (UChar)c;
      for(int32_t i = 0; i < length; ++i) {
        array[i] = unit;
      }
      setLength(length);
    }
  } else {  // supplementary code point, write surrogate pairs
    if(count > (INT32_MAX / 2)) {
      // We would get more than 2G UChars.
      allocate(capacity);
      return;
    }
    int32_t length = count * 2;
    if(capacity < length) {
      capacity = length;
    }
    if(allocate(capacity)) {
      UChar *array = getArrayStart();
      UChar lead = U16_LEAD(c);
      UChar trail = U16_TRAIL(c);
      for(int32_t i = 0; i < length; i += 2) {
        array[i] = lead;
        array[i + 1] = trail;
      }
      setLength(length);
    }
  }
}